

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O2

uint highbd_masked_sad16xh_avx2
               (uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,
               uint8_t *m_ptr,int m_stride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 (*pauVar7) [32];
  long lVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [32];
  int iVar13;
  undefined1 (*pauVar14) [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  
  pauVar9 = (undefined1 (*) [32])((long)src8 * 2);
  pauVar7 = (undefined1 (*) [32])((long)a8 * 2);
  pauVar10 = (undefined1 (*) [32])((long)b8 * 2);
  iVar13 = 0;
  if (height < 1) {
    height = 0;
  }
  auVar15 = ZEXT1664((undefined1  [16])0x0);
  auVar16._8_2_ = 0x40;
  auVar16._0_8_ = 0x40004000400040;
  auVar16._10_2_ = 0x40;
  auVar16._12_2_ = 0x40;
  auVar16._14_2_ = 0x40;
  auVar16._16_2_ = 0x40;
  auVar16._18_2_ = 0x40;
  auVar16._20_2_ = 0x40;
  auVar16._22_2_ = 0x40;
  auVar16._24_2_ = 0x40;
  auVar16._26_2_ = 0x40;
  auVar16._28_2_ = 0x40;
  auVar16._30_2_ = 0x40;
  auVar17._8_4_ = 0x20;
  auVar17._0_8_ = 0x2000000020;
  auVar17._12_4_ = 0x20;
  auVar17._16_4_ = 0x20;
  auVar17._20_4_ = 0x20;
  auVar17._24_4_ = 0x20;
  auVar17._28_4_ = 0x20;
  auVar18._8_2_ = 1;
  auVar18._0_8_ = 0x1000100010001;
  auVar18._10_2_ = 1;
  auVar18._12_2_ = 1;
  auVar18._14_2_ = 1;
  auVar18._16_2_ = 1;
  auVar18._18_2_ = 1;
  auVar18._20_2_ = 1;
  auVar18._22_2_ = 1;
  auVar18._24_2_ = 1;
  auVar18._26_2_ = 1;
  auVar18._28_2_ = 1;
  auVar18._30_2_ = 1;
  for (; iVar13 != height; iVar13 = iVar13 + 1) {
    pauVar11 = pauVar7;
    pauVar12 = pauVar10;
    pauVar14 = pauVar9;
    for (lVar8 = 0; lVar8 < width; lVar8 = lVar8 + 0x10) {
      auVar2 = vlddqu_avx(*pauVar14);
      auVar19 = vlddqu_avx(*pauVar11);
      auVar3 = vlddqu_avx(*pauVar12);
      auVar1 = vlddqu_avx(*(undefined1 (*) [16])(m_ptr + lVar8));
      auVar4 = vpmovzxbw_avx2(auVar1);
      auVar5 = vpsubw_avx2(auVar16,auVar4);
      auVar20 = vpunpcklwd_avx2(auVar19,auVar3);
      auVar6 = vpunpcklwd_avx2(auVar4,auVar5);
      auVar20 = vpmaddwd_avx2(auVar20,auVar6);
      auVar20 = vpaddd_avx2(auVar20,auVar17);
      auVar20 = vpsrad_avx2(auVar20,6);
      auVar19 = vpunpckhwd_avx2(auVar19,auVar3);
      auVar3 = vpunpckhwd_avx2(auVar4,auVar5);
      auVar19 = vpmaddwd_avx2(auVar19,auVar3);
      auVar19 = vpaddd_avx2(auVar19,auVar17);
      auVar19 = vpsrad_avx2(auVar19,6);
      auVar19 = vpackssdw_avx2(auVar20,auVar19);
      auVar2 = vpsubw_avx2(auVar19,auVar2);
      auVar2 = vpabsw_avx2(auVar2);
      auVar2 = vpmaddwd_avx2(auVar2,auVar18);
      auVar2 = vpaddd_avx2(auVar2,auVar15._0_32_);
      auVar15 = ZEXT3264(auVar2);
      pauVar12 = pauVar12 + 1;
      pauVar11 = pauVar11 + 1;
      pauVar14 = pauVar14 + 1;
    }
    m_ptr = m_ptr + m_stride;
    pauVar10 = (undefined1 (*) [32])(*pauVar10 + (long)b_stride * 2);
    pauVar7 = (undefined1 (*) [32])(*pauVar7 + (long)a_stride * 2);
    pauVar9 = (undefined1 (*) [32])(*pauVar9 + (long)src_stride * 2);
  }
  auVar16 = vphaddd_avx2(auVar15._0_32_,auVar15._0_32_);
  auVar16 = vphaddd_avx2(auVar16,auVar16);
  auVar1 = vpaddd_avx(auVar16._0_16_,auVar16._16_16_);
  return auVar1._0_4_;
}

Assistant:

static inline unsigned int highbd_masked_sad16xh_avx2(
    const uint8_t *src8, int src_stride, const uint8_t *a8, int a_stride,
    const uint8_t *b8, int b_stride, const uint8_t *m_ptr, int m_stride,
    int width, int height) {
  const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a_ptr = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b_ptr = CONVERT_TO_SHORTPTR(b8);
  int x, y;
  __m256i res = _mm256_setzero_si256();
  const __m256i mask_max = _mm256_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_const =
      _mm256_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m256i one = _mm256_set1_epi16(1);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 16) {
      const __m256i src = _mm256_lddqu_si256((const __m256i *)&src_ptr[x]);
      const __m256i a = _mm256_lddqu_si256((const __m256i *)&a_ptr[x]);
      const __m256i b = _mm256_lddqu_si256((const __m256i *)&b_ptr[x]);
      // Zero-extend mask to 16 bits
      const __m256i m =
          _mm256_cvtepu8_epi16(_mm_lddqu_si128((const __m128i *)&m_ptr[x]));
      const __m256i m_inv = _mm256_sub_epi16(mask_max, m);

      const __m256i data_l = _mm256_unpacklo_epi16(a, b);
      const __m256i mask_l = _mm256_unpacklo_epi16(m, m_inv);
      __m256i pred_l = _mm256_madd_epi16(data_l, mask_l);
      pred_l = _mm256_srai_epi32(_mm256_add_epi32(pred_l, round_const),
                                 AOM_BLEND_A64_ROUND_BITS);

      const __m256i data_r = _mm256_unpackhi_epi16(a, b);
      const __m256i mask_r = _mm256_unpackhi_epi16(m, m_inv);
      __m256i pred_r = _mm256_madd_epi16(data_r, mask_r);
      pred_r = _mm256_srai_epi32(_mm256_add_epi32(pred_r, round_const),
                                 AOM_BLEND_A64_ROUND_BITS);

      // Note: the maximum value in pred_l/r is (2^bd)-1 < 2^15,
      // so it is safe to do signed saturation here.
      const __m256i pred = _mm256_packs_epi32(pred_l, pred_r);
      // There is no 16-bit SAD instruction, so we have to synthesize
      // an 8-element SAD. We do this by storing 4 32-bit partial SADs,
      // and accumulating them at the end
      const __m256i diff = _mm256_abs_epi16(_mm256_sub_epi16(pred, src));
      res = _mm256_add_epi32(res, _mm256_madd_epi16(diff, one));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have four 32-bit partial SADs stored in 'res'.
  res = _mm256_hadd_epi32(res, res);
  res = _mm256_hadd_epi32(res, res);
  int sad = _mm256_extract_epi32(res, 0) + _mm256_extract_epi32(res, 4);
  return sad;
}